

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt1Float1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  RegOpnd *this_00;
  undefined4 *puVar3;
  Instr *pIVar4;
  IRType local_69;
  Instr *instr;
  RegOpnd *tmpDst;
  RegOpnd *pRStack_38;
  OpCode op;
  RegOpnd *dstOpnd;
  RegOpnd *local_28;
  RegOpnd *srcOpnd;
  RegSlot srcRegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  local_28 = BuildSrcOpnd(this,srcRegSlot,TyFloat32);
  IR::Opnd::SetValueType(&local_28->super_Opnd,ValueType::Float);
  pRStack_38 = (RegOpnd *)0x0;
  tmpDst._6_2_ = Nop;
  if (newOpcode == Reinterpret_FTI) {
    pRStack_38 = BuildDstOpnd(this,dstRegSlot,TyInt32);
    tmpDst._6_2_ = Reinterpret_Prim;
  }
  else if (newOpcode == Conv_FTI) {
    pRStack_38 = BuildDstOpnd(this,dstRegSlot,TyInt32);
    tmpDst._6_2_ = Conv_Prim;
  }
  else if (newOpcode == Conv_FTU) {
    pRStack_38 = BuildDstOpnd(this,dstRegSlot,TyUint32);
    tmpDst._6_2_ = Conv_Prim;
  }
  else if ((newOpcode == Conv_Check_FTI) || (newOpcode == Conv_Check_FTU)) {
    this_00 = IR::RegOpnd::New(TyFloat32,this->m_func);
    IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Float);
    pIVar4 = IR::Instr::New(TrapIfTruncOverflow,&this_00->super_Opnd,&local_28->super_Opnd,
                            this->m_func);
    AddInstr(this,pIVar4,offset);
    local_69 = TyInt32;
    if (newOpcode != Conv_Check_FTI) {
      local_69 = TyUint32;
    }
    pRStack_38 = BuildDstOpnd(this,dstRegSlot,local_69);
    pRStack_38->field_0x18 = pRStack_38->field_0x18 & 0xfb | 4;
    tmpDst._6_2_ = Conv_Prim;
    local_28 = this_00;
  }
  else if (newOpcode == Conv_Sat_FTI) {
    pRStack_38 = BuildDstOpnd(this,dstRegSlot,TyInt32);
    tmpDst._6_2_ = Conv_Prim_Sat;
  }
  else if (newOpcode == Conv_Sat_FTU) {
    pRStack_38 = BuildDstOpnd(this,dstRegSlot,TyUint32);
    tmpDst._6_2_ = Conv_Prim_Sat;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x862,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr();
    *puVar3 = 0;
  }
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&pRStack_38->super_Opnd,valueType);
  pIVar4 = IR::Instr::New(tmpDst._6_2_,&pRStack_38->super_Opnd,&local_28->super_Opnd,this->m_func);
  AddInstr(this,pIVar4,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Float1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat32);
    srcOpnd->SetValueType(ValueType::Float);
    IR::RegOpnd * dstOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Nop;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_FTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Reinterpret_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Reinterpret_Prim;
        break;

    case Js::OpCodeAsmJs::Conv_Check_FTI:
    case Js::OpCodeAsmJs::Conv_Check_FTU:
    {
        IR::RegOpnd* tmpDst = IR::RegOpnd::New(TyFloat32, m_func);
        tmpDst->SetValueType(ValueType::Float);
        AddInstr(IR::Instr::New(Js::OpCode::TrapIfTruncOverflow, tmpDst, srcOpnd, m_func), offset);
        dstOpnd = BuildDstOpnd(dstRegSlot, newOpcode == Js::OpCodeAsmJs::Conv_Check_FTI ? TyInt32 : TyUint32);
        dstOpnd->m_dontDeadStore = true;
        srcOpnd = tmpDst;
        op = Js::OpCode::Conv_Prim;
        break;
    }
    default:
        Assume(UNREACHED);
    }
    dstOpnd->SetValueType(ValueType::GetInt(false));
    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}